

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolygonIntegrationPoints.h
# Opt level: O0

IntegrationPointList<2> *
anurbs::PolygonIntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,Index degree,Polygon *polygon)

{
  double dVar1;
  long lVar2;
  bool bVar3;
  Index IVar4;
  size_type sVar5;
  __tuple_element_t<0UL,_tuple<double,_double,_double,_double>_> *scalar;
  __tuple_element_t<1UL,_tuple<double,_double,_double,_double>_> *scalar_00;
  __tuple_element_t<2UL,_tuple<double,_double,_double,_double>_> *scalar_01;
  __tuple_element_t<3UL,_tuple<double,_double,_double,_double>_> *p_Var6;
  reference this;
  double local_2f8;
  CoeffReturnType local_2f0;
  CoeffReturnType local_2e8;
  tuple<double,_double,_double> local_2e0;
  type local_2c8;
  type local_2a8;
  type local_288;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  local_268;
  undefined1 local_218 [8];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
  uv;
  tuple<double,_double,_double,_double> *norm_point;
  const_iterator __end3;
  const_iterator __begin3;
  IntegrationPointList<3> *__range3;
  Matrix<double,_1,_2,_1,_1,_2> local_168;
  double local_150;
  double local_148;
  double area;
  undefined1 local_128 [8];
  Vector2d ac;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
  local_110;
  undefined1 local_f8 [8];
  Vector2d ab;
  Vector2d vertex_c;
  Vector2d vertex_b;
  Vector2d vertex_a;
  type *c;
  type *b;
  type *a;
  long local_88;
  Index i;
  Index j;
  Index nb_integration_points;
  IntegrationPointList<3> *xiao_gimbutas;
  undefined1 local_58 [8];
  PolygonTessellation tessellation;
  Polygon *polygon_local;
  Index degree_local;
  IntegrationPointList<2> *integration_points;
  
  tessellation.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>::
  vector(__return_storage_ptr__);
  PolygonTessellation::PolygonTessellation((PolygonTessellation *)local_58);
  PolygonTessellation::compute((PolygonTessellation *)local_58,polygon);
  nb_integration_points = (Index)IntegrationPoints::xiao_gimbutas(degree);
  IVar4 = PolygonTessellation::nb_triangles((PolygonTessellation *)local_58);
  sVar5 = std::
          vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
          ::size((vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
                  *)nb_integration_points);
  j = IVar4 * sVar5;
  std::
  vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>::
  resize(__return_storage_ptr__,j);
  i = 0;
  local_88 = 0;
  while( true ) {
    lVar2 = local_88;
    IVar4 = PolygonTessellation::nb_triangles((PolygonTessellation *)local_58);
    if (IVar4 <= lVar2) break;
    PolygonTessellation::triangle((TriangleIndices *)&a,(PolygonTessellation *)local_58,local_88);
    std::get<0ul,long,long,long>((tuple<long,_long,_long> *)&a);
    std::get<1ul,long,long,long>((tuple<long,_long,_long> *)&a);
    std::get<2ul,long,long,long>((tuple<long,_long,_long> *)&a);
    Polygon::vertex((Polygon *)
                    (vertex_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage
                     .m_data.array + 1),(Index)polygon);
    Polygon::vertex((Polygon *)
                    (vertex_c.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage
                     .m_data.array + 1),(Index)polygon);
    Polygon::vertex((Polygon *)
                    (ab.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                     m_data.array + 1),(Index)polygon);
    Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator-
              (&local_110,
               (MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)
               (vertex_c.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                m_data.array + 1),
               (MatrixBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
               (vertex_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                m_data.array + 1));
    Eigen::Matrix<double,1,2,1,1,2>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
              ((Matrix<double,1,2,1,1,2> *)local_f8,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)&local_110);
    Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
                *)&area,(MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)
                        (ab.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                         m_data.array + 1),
               (MatrixBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_> *)
               (vertex_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                m_data.array + 1));
    Eigen::Matrix<double,1,2,1,1,2>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::Matrix<double,1,2,1,1,2>const>>
              ((Matrix<double,1,2,1,1,2> *)local_128,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
                *)&area);
    Eigen::Matrix<double,_1,_2,_1,_1,_2>::Matrix
              (&local_168,(Matrix<double,_1,_2,_1,_1,_2> *)local_f8);
    Eigen::Matrix<double,_1,_2,_1,_1,_2>::Matrix
              ((Matrix<double,_1,_2,_1,_1,_2> *)&__range3,(Matrix<double,_1,_2,_1,_1,_2> *)local_128
              );
    local_150 = cross(&local_168,(Vector<2> *)&__range3);
    local_148 = norm(&local_150);
    IVar4 = nb_integration_points;
    local_148 = local_148 * 0.5;
    __end3 = std::
             vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
             ::begin((vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
                      *)nb_integration_points);
    norm_point = (tuple<double,_double,_double,_double> *)
                 std::
                 vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
                 ::end((vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>
                        *)IVar4);
    while( true ) {
      bVar3 = __gnu_cxx::operator!=
                        (&__end3,(__normal_iterator<const_std::tuple<double,_double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>_>
                                  *)&norm_point);
      if (!bVar3) break;
      uv._120_8_ = __gnu_cxx::
                   __normal_iterator<const_std::tuple<double,_double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>_>
                   ::operator*(&__end3);
      scalar = std::get<0ul,double,double,double,double>
                         ((tuple<double,_double,_double,_double> *)uv._120_8_);
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                (&local_288,
                 (MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)
                 (vertex_b.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                  m_data.array + 1),scalar);
      scalar_00 = std::get<1ul,double,double,double,double>
                            ((tuple<double,_double,_double,_double> *)uv._120_8_);
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                (&local_2a8,
                 (MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)
                 (vertex_c.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.
                  m_data.array + 1),scalar_00);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>>
      ::operator+(&local_268,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>>
                   *)&local_288,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                   *)&local_2a8);
      scalar_01 = std::get<2ul,double,double,double,double>
                            ((tuple<double,_double,_double,_double> *)uv._120_8_);
      Eigen::MatrixBase<Eigen::Matrix<double,1,2,1,1,2>>::operator*
                (&local_2c8,
                 (MatrixBase<Eigen::Matrix<double,1,2,1,1,2>> *)
                 (ab.super_PlainObjectBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>.m_storage.m_data.
                  array + 1),scalar_01);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const>>
      ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                   *)local_218,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,1,2,1,1,2>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>const>const>const>>
                   *)&local_268,
                  (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>
                   *)&local_2c8);
      local_2e8 = Eigen::
                  DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_0>
                  ::operator[]((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_0>
                                *)local_218,0);
      local_2f0 = Eigen::
                  DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_0>
                  ::operator[]((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>,_0>
                                *)local_218,1);
      dVar1 = local_148;
      p_Var6 = std::get<3ul,double,double,double,double>
                         ((tuple<double,_double,_double,_double> *)uv._120_8_);
      local_2f8 = dVar1 * *p_Var6;
      std::tuple<double,_double,_double>::tuple<double,_double,_double,_true,_true>
                (&local_2e0,&local_2e8,&local_2f0,&local_2f8);
      IVar4 = i;
      i = i + 1;
      this = std::
             vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
             ::operator[](__return_storage_ptr__,IVar4);
      std::tuple<double,_double,_double>::operator=(this,&local_2e0);
      __gnu_cxx::
      __normal_iterator<const_std::tuple<double,_double,_double,_double>_*,_std::vector<std::tuple<double,_double,_double,_double>,_std::allocator<std::tuple<double,_double,_double,_double>_>_>_>
      ::operator++(&__end3);
    }
    local_88 = local_88 + 1;
  }
  tessellation.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
  PolygonTessellation::~PolygonTessellation((PolygonTessellation *)local_58);
  if ((tessellation.m_quads.super__Vector_base<long,_std::allocator<long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    std::
    vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<2> get(const Index degree, const Polygon& polygon)
    {
        using Vector2d = Eigen::Matrix<double, 1, 2>;

        IntegrationPointList<2> integration_points;
        PolygonTessellation tessellation;

        tessellation.compute(polygon);

        const auto& xiao_gimbutas = IntegrationPoints::xiao_gimbutas(degree);

        const Index nb_integration_points = tessellation.nb_triangles() *
            static_cast<Index>(xiao_gimbutas.size());

        integration_points.resize(nb_integration_points);

        Index j = 0;

        for (Index i = 0; i < tessellation.nb_triangles(); i++) {
            const auto [a, b, c] = tessellation.triangle(i);

            const Vector2d vertex_a = polygon.vertex(a);
            const Vector2d vertex_b = polygon.vertex(b);
            const Vector2d vertex_c = polygon.vertex(c);

            const Vector2d ab = vertex_b - vertex_a;
            const Vector2d ac = vertex_c - vertex_a;

            const double area = 0.5 * norm(cross(ab, ac));

            for (const auto& norm_point : xiao_gimbutas) {
                const auto uv = vertex_a * std::get<0>(norm_point) +
                                vertex_b * std::get<1>(norm_point) +
                                vertex_c * std::get<2>(norm_point);

                integration_points[j++] = IntegrationPoint<2>(uv[0], uv[1],
                    area * std::get<3>(norm_point));
            }
        }

        return integration_points;
    }